

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSendMessage(HelicsEndpoint endpoint,HelicsMessage message,HelicsError *err)

{
  ushort uVar1;
  HelicsMessage pvVar2;
  undefined8 *__n;
  HelicsError *pHVar3;
  int in_R8D;
  bool bVar4;
  
  pHVar3 = err;
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (endpoint == (HelicsEndpoint)0x0) {
      if (err != (HelicsError *)0x0) goto LAB_001ae67f;
      goto LAB_001ae690;
    }
    bVar4 = *(int *)((long)endpoint + 0x20) == -0x4bac6b3e;
    __n = (undefined8 *)0x0;
    if (bVar4) {
      __n = (undefined8 *)endpoint;
    }
    pHVar3 = (HelicsError *)CONCAT71((int7)((ulong)err >> 8),bVar4 || err == (HelicsError *)0x0);
    if (!bVar4 && err != (HelicsError *)0x0) {
LAB_001ae67f:
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      goto LAB_001ae690;
    }
  }
  else {
LAB_001ae690:
    __n = (undefined8 *)0x0;
  }
  if (__n == (undefined8 *)0x0) {
    return;
  }
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (message == (HelicsMessage)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001ae6e5;
    }
    else {
      uVar1 = *(ushort *)((long)message + 10);
      pHVar3 = (HelicsError *)(ulong)uVar1;
      pvVar2 = (HelicsMessage)0x0;
      if (uVar1 == 0xb3) {
        pvVar2 = message;
      }
      if (uVar1 == 0xb3 || err == (HelicsError *)0x0) goto LAB_001ae6e7;
    }
    err->error_code = -4;
    err->message = "The message object was not valid";
  }
LAB_001ae6e5:
  pvVar2 = (HelicsMessage)0x0;
LAB_001ae6e7:
  if (pvVar2 != (HelicsMessage)0x0) {
    helics::Endpoint::send((Endpoint *)*__n,(int)pvVar2,pHVar3,(size_t)__n,in_R8D);
  }
  return;
}

Assistant:

void helicsEndpointSendMessage(HelicsEndpoint endpoint, HelicsMessage message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        endObj->endPtr->send(*mess);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}